

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

PegoutKeyData *
cfd::core::ConfidentialTransaction::GetPegoutPubkeyData
          (PegoutKeyData *__return_storage_ptr__,Pubkey *online_pubkey,Privkey *master_online_key,
          string *bitcoin_descriptor,uint32_t bip32_counter,ByteData *whitelist,NetType net_type,
          ByteData *pubkey_prefix,NetType elements_net_type,Address *descriptor_derive_address)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  bool bVar1;
  size_t sVar2;
  CfdException *pCVar3;
  ulong uVar4;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  uint whitelist_index;
  ByteData256 tweak_sum;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> online_keys;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_2c8;
  ByteData whitelist_proof;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> offline_keys;
  ByteData btcpubkeybytes;
  Pubkey offline_pubkey;
  ByteData prefix;
  vector<unsigned_char,_std::allocator<unsigned_char>_> whitelist_bytes;
  ExtPubkey xpub;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_150;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_138;
  ByteData offline_pubkey_negate;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  ExtPubkey child_xpub;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  PegoutKeyData::PegoutKeyData(__return_storage_ptr__);
  offline_keys.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  offline_keys.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  offline_keys.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  online_keys.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  online_keys.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  online_keys.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ByteData::GetBytes(&whitelist_bytes,whitelist);
  uVar4 = (long)whitelist_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)whitelist_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (((uint)uVar4 == 0) || ((int)((uVar4 & 0xffffffff) % 0x42) != 0)) {
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&xpub,"whitelist length error.",(allocator *)&child_xpub);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&xpub);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (1000000000 < bip32_counter) {
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&xpub,"bip32_counter over error.",(allocator *)&child_xpub);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&xpub);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar1 = Pubkey::IsValid(online_pubkey);
  if (bVar1) {
    bVar1 = Privkey::IsValid(master_online_key);
    if (bVar1) {
      Privkey::GeneratePubkey((Pubkey *)&xpub,master_online_key,true);
      bVar1 = Pubkey::Equals((Pubkey *)&xpub,online_pubkey);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&xpub);
      if (bVar1) {
        if (0x4241 < (uint)uVar4) {
          pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)&xpub,"Illegal whitelist maximum error.",(allocator *)&child_xpub);
          CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&xpub);
          __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
        }
        uVar4 = (ulong)(ushort)((ushort)uVar4 / 0x42);
        __first._M_current =
             whitelist_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
        while (bVar1 = uVar4 != 0, uVar4 = uVar4 - 1, bVar1) {
          __last._M_current = __first._M_current + 0x21;
          ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&child_xpub,__first,
                     __last,(allocator_type *)&tweak_sum);
          ByteData::ByteData((ByteData *)&local_48,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&child_xpub);
          Pubkey::Pubkey((Pubkey *)&xpub,(ByteData *)&local_48);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_48);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&child_xpub);
          Pubkey::GetData((ByteData *)&child_xpub,(Pubkey *)&xpub);
          ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
          emplace_back<cfd::core::ByteData>(&offline_keys,(ByteData *)&child_xpub);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&child_xpub);
          __first._M_current = __first._M_current + 0x42;
          ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&tweak_sum,__last,
                     __first,(allocator_type *)&prefix);
          ByteData::ByteData((ByteData *)&local_60,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_sum);
          Pubkey::Pubkey((Pubkey *)&child_xpub,(ByteData *)&local_60);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_60);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_sum);
          Pubkey::GetData((ByteData *)&tweak_sum,(Pubkey *)&child_xpub);
          ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
          emplace_back<cfd::core::ByteData>(&online_keys,(ByteData *)&tweak_sum);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_sum);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&child_xpub);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&xpub);
        }
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&prefix.data_,&pubkey_prefix->data_);
        bVar1 = ByteData::IsEmpty(pubkey_prefix);
        if (kRegtest < net_type || !bVar1) {
          sVar2 = ByteData::GetDataSize(&prefix);
          if (sVar2 != 4) {
            pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::__cxx11::string::string
                      ((string *)&xpub,"Illegal prefix and nettype.",(allocator *)&child_xpub);
            CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&xpub);
            __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
          }
        }
        ExtPubkey::ExtPubkey(&xpub);
        GenerateExtPubkeyFromDescriptor
                  (&child_xpub,bitcoin_descriptor,bip32_counter,pubkey_prefix,net_type,
                   elements_net_type,&xpub,descriptor_derive_address);
        Pubkey::GetData((ByteData *)&local_108,online_pubkey);
        whitelist_index = 0;
        while( true ) {
          uVar4 = (ulong)whitelist_index;
          if ((ulong)(((long)online_keys.
                             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)online_keys.
                            super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar4) {
            tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = "cfdcore_elements_transaction.cpp";
            tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xd65;
            tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = "GetPegoutPubkeyData";
            logger::warn<>((CfdSourceLocation *)&tweak_sum,"online_pubkey not exists.");
            pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::__cxx11::string::string
                      ((string *)&tweak_sum,"online_pubkey not exists.",(allocator *)&offline_pubkey
                      );
            CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tweak_sum);
            __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
          }
          bVar1 = ByteData::Equals((ByteData *)&local_108,
                                   online_keys.
                                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar4);
          if (bVar1) break;
          whitelist_index = whitelist_index + 1;
        }
        Extkey::GetPubkey(&offline_pubkey,&xpub.super_Extkey);
        Pubkey::GetData((ByteData *)&tweak_sum,&offline_pubkey);
        WallyUtil::NegatePubkey(&offline_pubkey_negate,(ByteData *)&tweak_sum);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_sum);
        bVar1 = ByteData::Equals(offline_keys.
                                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar4,
                                 &offline_pubkey_negate);
        if (bVar1) {
          Extkey::GetPubTweakSum(&tweak_sum,&child_xpub.super_Extkey);
          Pubkey::GetData(&whitelist_proof,&offline_pubkey);
          WallyUtil::AddTweakPubkey(&btcpubkeybytes,&whitelist_proof,&tweak_sum,false);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&whitelist_proof
                    );
          Privkey::GetData((ByteData *)&local_150,master_online_key);
          ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138,
                             (ByteData *)&local_150);
          ByteData256::ByteData256
                    ((ByteData256 *)&local_2c8,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
          WallyUtil::SignWhitelist
                    (&whitelist_proof,&btcpubkeybytes,(ByteData256 *)&local_2c8,&tweak_sum,
                     &online_keys,&offline_keys,whitelist_index);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_2c8);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_138);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_150);
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_168,
                     &btcpubkeybytes.data_);
          Pubkey::Pubkey((Pubkey *)&local_2c8,(ByteData *)&local_168);
          ByteData::operator=((ByteData *)__return_storage_ptr__,(ByteData *)&local_2c8);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_2c8);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_168);
          ByteData::operator=(&__return_storage_ptr__->whitelist_proof,&whitelist_proof);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&whitelist_proof
                    );
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&btcpubkeybytes)
          ;
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_sum);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &offline_pubkey_negate);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&offline_pubkey)
          ;
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_108);
          Extkey::~Extkey(&child_xpub.super_Extkey);
          Extkey::~Extkey(&xpub.super_Extkey);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&prefix);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&whitelist_bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                    (&online_keys);
          ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                    (&offline_keys);
          return __return_storage_ptr__;
        }
        tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "cfdcore_elements_transaction.cpp";
        tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0xd6d;
        tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = "GetPegoutPubkeyData";
        logger::warn<>((CfdSourceLocation *)&tweak_sum,"offline_pubkey not exists.");
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&tweak_sum,"offline_pubkey not exists.",(allocator *)&btcpubkeybytes);
        CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tweak_sum);
        __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&xpub,"Illegal online key error.",(allocator *)&child_xpub);
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&xpub);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

PegoutKeyData ConfidentialTransaction::GetPegoutPubkeyData(
    const Pubkey &online_pubkey, const Privkey &master_online_key,
    const std::string &bitcoin_descriptor, uint32_t bip32_counter,
    const ByteData &whitelist, NetType net_type, const ByteData &pubkey_prefix,
    NetType elements_net_type, Address *descriptor_derive_address) {
  static constexpr uint32_t kPegoutBip32CountMaximum = 1000000000;
  static constexpr uint32_t kWhitelistCountMaximum = 256;
  static constexpr uint32_t kPubkeySize = Pubkey::kCompressedPubkeySize;
  static constexpr uint32_t kWhitelistSingleSize = kPubkeySize * 2;
  PegoutKeyData result;
  std::vector<ByteData> offline_keys;
  std::vector<ByteData> online_keys;
  std::vector<uint8_t> whitelist_bytes = whitelist.GetBytes();
  uint32_t whitelist_size = static_cast<uint32_t>(whitelist_bytes.size());

  if ((whitelist_size == 0) ||
      ((whitelist_size % kWhitelistSingleSize) != 0)) {
    throw CfdException(kCfdIllegalArgumentError, "whitelist length error.");
  }
  // parameter check
  if (bip32_counter > kPegoutBip32CountMaximum) {
    throw CfdException(kCfdIllegalArgumentError, "bip32_counter over error.");
  }
  if ((!online_pubkey.IsValid()) || (!master_online_key.IsValid()) ||
      (!master_online_key.GeneratePubkey().Equals(online_pubkey))) {
    throw CfdException(kCfdIllegalArgumentError, "Illegal online key error.");
  }

  // CreatePAKListFromExtensionSpace
  decltype(whitelist_bytes)::const_iterator ite = whitelist_bytes.begin();
  uint32_t whitelist_count = whitelist_size / kWhitelistSingleSize;
  if (whitelist_count > kWhitelistCountMaximum) {
    throw CfdException(
        kCfdIllegalArgumentError, "Illegal whitelist maximum error.");
  }

  try {
    for (uint32_t index = 0; index < whitelist_count; ++index) {
      uint32_t offline_key_start = index * kWhitelistSingleSize;
      uint32_t offline_key_end = offline_key_start + kPubkeySize;
      uint32_t online_key_start = offline_key_start + kPubkeySize;
      uint32_t online_key_end = (index + 1) * kWhitelistSingleSize;
      Pubkey offline_key(std::vector<uint8_t>(
          ite + offline_key_start, ite + offline_key_end));
      offline_keys.push_back(offline_key.GetData());
      Pubkey online_key(
          std::vector<uint8_t>(ite + online_key_start, ite + online_key_end));
      online_keys.push_back(online_key.GetData());
    }
  } catch (const CfdException &except) {
    throw CfdException(
        kCfdIllegalArgumentError,
        "Illegal whitelist key. (" + std::string(except.what()) + ")");
  }

  ByteData prefix = pubkey_prefix;
  if (pubkey_prefix.IsEmpty() &&
      ((net_type == NetType::kTestnet) || (net_type == NetType::kRegtest) ||
       (net_type == NetType::kMainnet))) {
    // do nothing
  } else if (prefix.GetDataSize() != 4) {
    throw CfdException(
        kCfdIllegalArgumentError, "Illegal prefix and nettype.");
  }

  // check descriptor
  ExtPubkey xpub;
  ExtPubkey child_xpub = GenerateExtPubkeyFromDescriptor(
      bitcoin_descriptor, bip32_counter, pubkey_prefix, net_type,
      elements_net_type, &xpub, descriptor_derive_address);
  // FlatSigningProvider provider;
  // const auto descriptor = Parse(desc_str, provider);
  // if (!descriptor) desc_str = "pkh(" + xpub.GetBase58String() + "/0/*)";

  // check whitelist
  uint32_t whitelist_index = 0;
  bool is_find = false;
  const ByteData &online_pubkey_bytes = online_pubkey.GetData();
  for (uint32_t index = 0; index < online_keys.size(); ++index) {
    if (online_pubkey_bytes.Equals(online_keys[index])) {
      whitelist_index = index;
      is_find = true;
      break;
    }
  }
  if (!is_find) {
    warn(CFD_LOG_SOURCE, "online_pubkey not exists.");
    throw CfdException(kCfdIllegalArgumentError, "online_pubkey not exists.");
  }

  Pubkey offline_pubkey = xpub.GetPubkey();
  ByteData offline_pubkey_negate =
      WallyUtil::NegatePubkey(offline_pubkey.GetData());
  if (!offline_keys[whitelist_index].Equals(offline_pubkey_negate)) {
    warn(CFD_LOG_SOURCE, "offline_pubkey not exists.");
    throw CfdException(kCfdIllegalArgumentError, "offline_pubkey not exists.");
  }

  // calc tweak
  ByteData256 tweak_sum = child_xpub.GetPubTweakSum();
  ByteData btcpubkeybytes =
      WallyUtil::AddTweakPubkey(offline_pubkey.GetData(), tweak_sum);

  ByteData whitelist_proof = WallyUtil::SignWhitelist(
      btcpubkeybytes, ByteData256(master_online_key.GetData().GetBytes()),
      tweak_sum, online_keys, offline_keys, whitelist_index);

  result.btc_pubkey_bytes = Pubkey(btcpubkeybytes);
  result.whitelist_proof = whitelist_proof;
  return result;
}